

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  Particle<(pica::Dimension)2> particle;
  Particle<(pica::Dimension)2> particle_00;
  bool bVar1;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i_1;
  int i;
  ParticleArray particlesAnotherCopy;
  ParticleArray particlesCopy;
  ParticleArray particles;
  undefined8 in_stack_fffffffffffffc68;
  undefined1 success;
  String *in_stack_fffffffffffffc70;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc78;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  int line;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  Type type;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffca0;
  String local_348;
  Message *in_stack_fffffffffffffcc8;
  AssertHelper *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  uint uVar2;
  String local_310;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd00;
  ParticleArray *in_stack_fffffffffffffd08;
  ParticleArray *in_stack_fffffffffffffd10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  String *in_stack_fffffffffffffd28;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd30;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffd48;
  undefined8 local_2b0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_2a8;
  int local_2a0;
  undefined8 local_290;
  String *pSStack_288;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *local_280;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_278;
  undefined8 local_270;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_268;
  undefined8 local_260;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPStack_258;
  int local_24c;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
            (in_stack_fffffffffffffca0);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
            (in_stack_fffffffffffffca0);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
            (in_stack_fffffffffffffca0);
  for (local_24c = 0; local_24c < 9; local_24c = local_24c + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle(in_RDI);
    particle.position.y = (double)in_stack_fffffffffffffd18.ptr_;
    particle.position.x = (double)in_stack_fffffffffffffd10;
    particle.p.x = (double)in_stack_fffffffffffffd20;
    particle.p.y = (double)in_stack_fffffffffffffd28;
    particle.p.z = (double)in_stack_fffffffffffffd30;
    particle.factor = (FactorType)in_stack_fffffffffffffd38;
    particle.invGamma = (GammaType)in_stack_fffffffffffffd40;
    particle._56_8_ = in_stack_fffffffffffffd48;
    in_stack_fffffffffffffc68 = local_290;
    in_stack_fffffffffffffc70 = pSStack_288;
    in_stack_fffffffffffffc78 = local_280;
    in_stack_fffffffffffffc80 = pPStack_278;
    in_stack_fffffffffffffc88 = local_270;
    in_stack_fffffffffffffc90 = pPStack_268;
    in_stack_fffffffffffffc98 = local_260;
    in_stack_fffffffffffffca0 = pPStack_258;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>(in_stack_fffffffffffffd00,particle);
  }
  local_2a0 = 0;
  while( true ) {
    type = (Type)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    line = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
    success = (undefined1)((ulong)in_stack_fffffffffffffc68 >> 0x38);
    if (10 < local_2a0) break;
    in_stack_fffffffffffffc68 = in_stack_fffffffffffffd20;
    in_stack_fffffffffffffc70 = in_stack_fffffffffffffd28;
    in_stack_fffffffffffffc78 = in_stack_fffffffffffffd30;
    in_stack_fffffffffffffc80 = in_stack_fffffffffffffd38;
    in_stack_fffffffffffffc88 = in_stack_fffffffffffffd40;
    in_stack_fffffffffffffc90 = in_stack_fffffffffffffd48;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle(in_RDI);
    particle_00.position.y = (double)in_stack_fffffffffffffd18.ptr_;
    particle_00.position.x = (double)in_stack_fffffffffffffd10;
    particle_00.p.x = (double)in_stack_fffffffffffffc68;
    particle_00.p.y = (double)in_stack_fffffffffffffc70;
    particle_00.p.z = (double)in_stack_fffffffffffffc78;
    particle_00.factor = (FactorType)in_stack_fffffffffffffc80;
    particle_00.invGamma = (GammaType)in_stack_fffffffffffffc88;
    particle_00._56_8_ = in_stack_fffffffffffffc90;
    in_stack_fffffffffffffc98 = local_2b0;
    in_stack_fffffffffffffca0 = pPStack_2a8;
    in_stack_fffffffffffffd20 = in_stack_fffffffffffffc68;
    in_stack_fffffffffffffd28 = in_stack_fffffffffffffc70;
    in_stack_fffffffffffffd30 = in_stack_fffffffffffffc78;
    in_stack_fffffffffffffd38 = in_stack_fffffffffffffc80;
    in_stack_fffffffffffffd40 = in_stack_fffffffffffffc88;
    in_stack_fffffffffffffd48 = in_stack_fffffffffffffc90;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>(in_stack_fffffffffffffd00,particle_00);
    local_2a0 = local_2a0 + 1;
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::operator=
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::operator=
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::eqParticleArrays
            ((ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_> *)
             in_stack_fffffffffffffd18.ptr_,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffc70,(bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::internal::GetBoolAssertionFailureMessage
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               (char *)in_stack_fffffffffffffce0.ptr_,in_stack_fffffffffffffcd8,
               (char *)in_stack_fffffffffffffcd0);
    testing::internal::String::c_str(&local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffca0,type,(char *)in_stack_fffffffffffffc90,line
               ,(char *)in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::internal::String::~String(in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x2137f6);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2138a0);
  if (uVar2 == 0) {
    ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
    eqParticleArrays((ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
                      *)in_stack_fffffffffffffd18.ptr_,in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd08);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffc70,(bool)success);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffcd8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffca0);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)CONCAT44(uVar2,in_stack_fffffffffffffce8),
                 (char *)in_stack_fffffffffffffce0.ptr_,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0);
      testing::internal::String::c_str(&local_348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffca0,type,(char *)in_stack_fffffffffffffc90,
                 line,(char *)in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
      testing::internal::String::~String(in_stack_fffffffffffffc70);
      testing::Message::~Message((Message *)0x213999);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x213a37);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc90);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc90);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (in_stack_fffffffffffffc90);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}